

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QtInstallDirectoryWithTriple>::emplace<QtInstallDirectoryWithTriple_const&>
          (QHash<QString,_QtInstallDirectoryWithTriple> *this,QString *key,
          QtInstallDirectoryWithTriple *args)

{
  long lVar1;
  bool bVar2;
  QHash<QString,_QtInstallDirectoryWithTriple> *in_RDX;
  QtInstallDirectoryWithTriple *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QHash<QString,_QtInstallDirectoryWithTriple> copy;
  QtInstallDirectoryWithTriple *in_stack_ffffffffffffff68;
  QtInstallDirectoryWithTriple *in_stack_ffffffffffffff70;
  QtInstallDirectoryWithTriple *in_stack_ffffffffffffff78;
  piter local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QString,_QtInstallDirectoryWithTriple>::isDetached
                    ((QHash<QString,_QtInstallDirectoryWithTriple> *)in_stack_ffffffffffffff70);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_>::
            shouldGrow((Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)
                       (in_RDI->d).d);
    if (bVar2) {
      QtInstallDirectoryWithTriple::QtInstallDirectoryWithTriple
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_60 = (piter)QHash<QString,_QtInstallDirectoryWithTriple>::
                        emplace_helper<QtInstallDirectoryWithTriple>(in_RDX,in_RDI,in_RSI);
      QtInstallDirectoryWithTriple::~QtInstallDirectoryWithTriple(in_stack_ffffffffffffff70);
    }
    else {
      local_60 = (piter)emplace_helper<QtInstallDirectoryWithTriple_const&>
                                  (in_RDX,in_RDI,in_stack_ffffffffffffff78);
    }
  }
  else {
    QHash<QString,_QtInstallDirectoryWithTriple>::QHash
              ((QHash<QString,_QtInstallDirectoryWithTriple> *)in_stack_ffffffffffffff70,
               (QHash<QString,_QtInstallDirectoryWithTriple> *)in_stack_ffffffffffffff68);
    QHash<QString,_QtInstallDirectoryWithTriple>::detach
              ((QHash<QString,_QtInstallDirectoryWithTriple> *)in_stack_ffffffffffffff70);
    local_60 = (piter)emplace_helper<QtInstallDirectoryWithTriple_const&>
                                (in_RDX,in_RDI,in_stack_ffffffffffffff78);
    QHash<QString,_QtInstallDirectoryWithTriple>::~QHash
              ((QHash<QString,_QtInstallDirectoryWithTriple> *)in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_60;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }